

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerApp::OnDiagGetAnswerMessage
          (CommissionerApp *this,string *aPeerAddr,NetDiagData *aDiagAnsMsg)

{
  LeaderData LVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  mapped_type *pmVar12;
  Address addr;
  Address local_58;
  Error local_40;
  
  local_58.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Address::Set(&local_40,&local_58,aPeerAddr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.mMessage._M_dataplus._M_p != &local_40.mMessage.field_2) {
    operator_delete(local_40.mMessage._M_dataplus._M_p);
  }
  if (local_40.mCode == kNone) {
    pmVar12 = std::
              map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
              ::operator[](&this->mDiagAnsDataMap,&local_58);
    (pmVar12->mMode).mIsStableNetworkDataRequired =
         (aDiagAnsMsg->mMode).mIsStableNetworkDataRequired;
    bVar2 = (aDiagAnsMsg->mMode).mIsMtd;
    (pmVar12->mMode).mIsRxOnWhenIdleMode = (aDiagAnsMsg->mMode).mIsRxOnWhenIdleMode;
    (pmVar12->mMode).mIsMtd = bVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pmVar12->mEui64,&aDiagAnsMsg->mEui64);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pmVar12->mExtMacAddr,&aDiagAnsMsg->mExtMacAddr);
    pmVar12->mMacAddr = aDiagAnsMsg->mMacAddr;
    (pmVar12->mRoute64).mIdSequence = (aDiagAnsMsg->mRoute64).mIdSequence;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(pmVar12->mRoute64).mMask,&(aDiagAnsMsg->mRoute64).mMask);
    std::vector<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
    ::operator=(&(pmVar12->mRoute64).mRouteData,&(aDiagAnsMsg->mRoute64).mRouteData);
    LVar1 = aDiagAnsMsg->mLeaderData;
    uVar10 = (aDiagAnsMsg->mMacCounters).mIfInUnknownProtos;
    uVar11 = (aDiagAnsMsg->mMacCounters).mIfInErrors;
    uVar6 = (aDiagAnsMsg->mMacCounters).mIfOutErrors;
    uVar7 = (aDiagAnsMsg->mMacCounters).mIfInUcastPkts;
    uVar8 = (aDiagAnsMsg->mMacCounters).mIfInBroadcastPkts;
    uVar9 = (aDiagAnsMsg->mMacCounters).mIfInDiscards;
    uVar3 = (aDiagAnsMsg->mMacCounters).mIfOutUcastPkts;
    uVar4 = (aDiagAnsMsg->mMacCounters).mIfOutBroadcastPkts;
    uVar5 = (aDiagAnsMsg->mMacCounters).mIfOutDiscards;
    (pmVar12->mMacCounters).mIfInDiscards = (aDiagAnsMsg->mMacCounters).mIfInDiscards;
    (pmVar12->mMacCounters).mIfOutUcastPkts = uVar3;
    (pmVar12->mMacCounters).mIfOutBroadcastPkts = uVar4;
    (pmVar12->mMacCounters).mIfOutDiscards = uVar5;
    (pmVar12->mMacCounters).mIfOutErrors = uVar6;
    (pmVar12->mMacCounters).mIfInUcastPkts = uVar7;
    (pmVar12->mMacCounters).mIfInBroadcastPkts = uVar8;
    (pmVar12->mMacCounters).mIfInDiscards = uVar9;
    pmVar12->mLeaderData = LVar1;
    (pmVar12->mMacCounters).mIfInUnknownProtos = uVar10;
    (pmVar12->mMacCounters).mIfInErrors = uVar11;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar12->mAddrs,&aDiagAnsMsg->mAddrs);
    std::
    vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>::
    operator=(&pmVar12->mChildTable,&aDiagAnsMsg->mChildTable);
    std::
    vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
    ::operator=(&pmVar12->mChildIpv6AddrsInfoList,&aDiagAnsMsg->mChildIpv6AddrsInfoList);
    pmVar12->mPresentFlags = aDiagAnsMsg->mPresentFlags;
    if (local_58.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnDiagGetAnswerMessage(const std::string &aPeerAddr, const NetDiagData &aDiagAnsMsg)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    mDiagAnsDataMap[addr] = aDiagAnsMsg;
}